

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlParserCtxtPtr xmlCreateMemoryParserCtxt(char *buffer,int size)

{
  xmlParserCtxtPtr ctxt;
  xmlParserInputBufferPtr in;
  xmlParserInputPtr input;
  
  if ((0 < size && buffer != (char *)0x0) &&
     (ctxt = xmlNewParserCtxt(), ctxt != (xmlParserCtxtPtr)0x0)) {
    in = xmlParserInputBufferCreateMem(buffer,size,XML_CHAR_ENCODING_NONE);
    if (in != (xmlParserInputBufferPtr)0x0) {
      input = xmlNewInputStream(ctxt);
      if (input != (xmlParserInputPtr)0x0) {
        input->filename = (char *)0x0;
        input->buf = in;
        xmlBufResetInput(in->buffer,input);
        inputPush(ctxt,input);
        return ctxt;
      }
      xmlFreeParserInputBuffer(in);
    }
    xmlFreeParserCtxt(ctxt);
  }
  return (xmlParserCtxtPtr)0x0;
}

Assistant:

xmlParserCtxtPtr
xmlCreateMemoryParserCtxt(const char *buffer, int size) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlParserInputBufferPtr buf;

    if (buffer == NULL)
	return(NULL);
    if (size <= 0)
	return(NULL);

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
	return(NULL);

    /* TODO: xmlParserInputBufferCreateStatic, requires some serious changes */
    buf = xmlParserInputBufferCreateMem(buffer, size, XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    input = xmlNewInputStream(ctxt);
    if (input == NULL) {
	xmlFreeParserInputBuffer(buf);
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    input->filename = NULL;
    input->buf = buf;
    xmlBufResetInput(input->buf->buffer, input);

    inputPush(ctxt, input);
    return(ctxt);
}